

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O1

void __thiscall
QArrayDataPointer<QMakeParser::BlockScope>::reallocateAndGrow
          (QArrayDataPointer<QMakeParser::BlockScope> *this,GrowthPosition where,qsizetype n,
          QArrayDataPointer<QMakeParser::BlockScope> *old)

{
  BlockScope *pBVar1;
  QArrayData *pQVar2;
  bool bVar3;
  int iVar4;
  bool bVar5;
  uchar uVar6;
  undefined1 uVar7;
  BlockScope *pBVar8;
  BlockScope *pBVar9;
  qsizetype qVar10;
  long lVar11;
  long in_FS_OFFSET;
  undefined1 auVar12 [16];
  QArrayDataPointer<QMakeParser::BlockScope> local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (old == (QArrayDataPointer<QMakeParser::BlockScope> *)0x0 && where == GrowsAtEnd) {
    pQVar2 = &this->d->super_QArrayData;
    if (pQVar2 == (QArrayData *)0x0) {
      bVar3 = true;
    }
    else {
      bVar3 = 1 < (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i;
    }
    if ((0 < n) && (!bVar3)) {
      if (pQVar2 == (QArrayData *)0x0) {
        qVar10 = 0;
        lVar11 = 0;
      }
      else {
        qVar10 = pQVar2->alloc;
        lVar11 = (this->size - pQVar2->alloc) +
                 ((long)((long)this->ptr -
                        ((ulong)((long)&pQVar2[1].alloc + 7U) & 0xfffffffffffffff0)) >> 4);
      }
      auVar12 = QArrayData::reallocateUnaligned(pQVar2,this->ptr,0x10,qVar10 + n + lVar11,Grow);
      this->d = (Data *)auVar12._0_8_;
      this->ptr = (BlockScope *)auVar12._8_8_;
      goto LAB_00290a92;
    }
  }
  local_38.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_38.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_38.ptr = (BlockScope *)&DAT_aaaaaaaaaaaaaaaa;
  allocateGrow(&local_38,this,n,where);
  if (this->size != 0) {
    lVar11 = this->size + (n >> 0x3f & n);
    if (this->d == (Data *)0x0) {
      bVar3 = true;
    }
    else {
      bVar3 = 1 < (this->d->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i;
    }
    pBVar8 = this->ptr;
    pBVar9 = pBVar8 + lVar11;
    if ((old != (QArrayDataPointer<QMakeParser::BlockScope> *)0x0) || (bVar3)) {
      if ((lVar11 != 0) && (0 < lVar11)) {
        do {
          iVar4 = pBVar8->braceLevel;
          bVar3 = pBVar8->special;
          bVar5 = pBVar8->inBranch;
          uVar6 = pBVar8->nest;
          uVar7 = pBVar8->field_0xf;
          pBVar1 = local_38.ptr + local_38.size;
          pBVar1->start = pBVar8->start;
          pBVar1->braceLevel = iVar4;
          pBVar1->special = bVar3;
          pBVar1->inBranch = bVar5;
          pBVar1->nest = uVar6;
          pBVar1->field_0xf = uVar7;
          pBVar8 = pBVar8 + 1;
          local_38.size = local_38.size + 1;
        } while (pBVar8 < pBVar9);
      }
    }
    else if ((lVar11 != 0) && (0 < lVar11)) {
      do {
        iVar4 = pBVar8->braceLevel;
        bVar3 = pBVar8->special;
        bVar5 = pBVar8->inBranch;
        uVar6 = pBVar8->nest;
        uVar7 = pBVar8->field_0xf;
        pBVar1 = local_38.ptr + local_38.size;
        pBVar1->start = pBVar8->start;
        pBVar1->braceLevel = iVar4;
        pBVar1->special = bVar3;
        pBVar1->inBranch = bVar5;
        pBVar1->nest = uVar6;
        pBVar1->field_0xf = uVar7;
        pBVar8 = pBVar8 + 1;
        local_38.size = local_38.size + 1;
      } while (pBVar8 < pBVar9);
    }
  }
  pQVar2 = &this->d->super_QArrayData;
  pBVar8 = this->ptr;
  *(undefined4 *)&this->d = local_38.d._0_4_;
  *(undefined4 *)((long)&this->d + 4) = local_38.d._4_4_;
  *(undefined4 *)&this->ptr = local_38.ptr._0_4_;
  *(undefined4 *)((long)&this->ptr + 4) = local_38.ptr._4_4_;
  qVar10 = this->size;
  this->size = local_38.size;
  local_38.d = (Data *)pQVar2;
  local_38.ptr = pBVar8;
  local_38.size = qVar10;
  if (old != (QArrayDataPointer<QMakeParser::BlockScope> *)0x0) {
    local_38.d = old->d;
    local_38.ptr = old->ptr;
    old->d = (Data *)pQVar2;
    old->ptr = pBVar8;
    local_38.size = old->size;
    old->size = qVar10;
  }
  if (&(local_38.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_38.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_38.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_38.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_38.d)->super_QArrayData,0x10,0x10);
    }
  }
LAB_00290a92:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

Q_NEVER_INLINE void reallocateAndGrow(QArrayData::GrowthPosition where, qsizetype n,
                                          QArrayDataPointer *old = nullptr)
    {
        if constexpr (QTypeInfo<T>::isRelocatable && alignof(T) <= alignof(std::max_align_t)) {
            if (where == QArrayData::GrowsAtEnd && !old && !needsDetach() && n > 0) {
                (*this)->reallocate(constAllocatedCapacity() - freeSpaceAtEnd() + n, QArrayData::Grow); // fast path
                return;
            }
        }

        QArrayDataPointer dp(allocateGrow(*this, n, where));
        if (n > 0)
            Q_CHECK_PTR(dp.data());
        if (where == QArrayData::GrowsAtBeginning) {
            Q_ASSERT(dp.freeSpaceAtBegin() >= n);
        } else {
            Q_ASSERT(dp.freeSpaceAtEnd() >= n);
        }
        if (size) {
            qsizetype toCopy = size;
            if (n < 0)
                toCopy += n;
            if (needsDetach() || old)
                dp->copyAppend(begin(), begin() + toCopy);
            else
                dp->moveAppend(begin(), begin() + toCopy);
            Q_ASSERT(dp.size == toCopy);
        }

        swap(dp);
        if (old)
            old->swap(dp);
    }